

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerImpl::DecodeCommissionerDataset
                  (Error *__return_storage_ptr__,CommissionerDataset *aDataset,Response *aResponse)

{
  ErrorCode EVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint16_t uVar4;
  Error *pEVar5;
  __shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ByteArray *pBVar7;
  mapped_type sessionId;
  CommissionerDataset dataset;
  TlvSet tlvSet;
  key_type local_d1;
  undefined1 local_d0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8 [4];
  CommissionerDataset local_a8;
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_50;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.mBorderAgentLocator = 0;
  local_a8.mSessionId = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_a8.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.mJoinerUdpPort = 0;
  local_a8.mAeUdpPort = 0;
  local_a8.mNmkpUdpPort = 0;
  local_a8.mPresentFlags = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  tlv::GetTlvSet((Error *)local_d0,(TlvSet *)&local_50,&aResponse->mPayload,kMeshCoP);
  pEVar5 = Error::operator=(__return_storage_ptr__,(Error *)local_d0);
  EVar1 = pEVar5->mCode;
  std::__cxx11::string::~string((string *)local_c8);
  if (EVar1 == kNone) {
    local_d1 = kCommissionerSessionId;
    p_Var6 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_50,&local_d1)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_d0,
               p_Var6);
    if (local_d0 != (undefined1  [8])0x0) {
      local_a8.mSessionId = tlv::Tlv::GetValueAsUint16((Tlv *)local_d0);
      local_a8._80_8_ = local_a8._80_8_ | 0x4000000000000000;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_c8);
    local_d1 = kBorderAgentLocator;
    p_Var6 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_50,&local_d1)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_d0,
               p_Var6);
    if (local_d0 != (undefined1  [8])0x0) {
      local_a8.mBorderAgentLocator = tlv::Tlv::GetValueAsUint16((Tlv *)local_d0);
      local_a8._80_8_ = local_a8._80_8_ | 0x8000000000000000;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_c8);
    local_d1 = kNetworkDiagIpv6Address;
    p_Var6 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_50,&local_d1)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_d0,
               p_Var6);
    if (local_d0 != (undefined1  [8])0x0) {
      pBVar7 = tlv::Tlv::GetValue((Tlv *)local_d0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_a8.mSteeringData,pBVar7);
      local_a8._80_8_ = local_a8._80_8_ | 0x2000000000000000;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_c8);
    local_d1 = kAeSteeringData;
    p_Var6 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_50,&local_d1)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_d0,
               p_Var6);
    if (local_d0 != (undefined1  [8])0x0) {
      pBVar7 = tlv::Tlv::GetValue((Tlv *)local_d0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_a8.mAeSteeringData,pBVar7);
      local_a8._80_8_ = local_a8._80_8_ | 0x1000000000000000;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_c8);
    local_d1 = kNmkpSteeringData;
    p_Var6 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_50,&local_d1)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_d0,
               p_Var6);
    if (local_d0 != (undefined1  [8])0x0) {
      pBVar7 = tlv::Tlv::GetValue((Tlv *)local_d0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&local_a8.mNmkpSteeringData,pBVar7);
      local_a8._80_8_ = local_a8._80_8_ | 0x800000000000000;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_c8);
    local_d1 = kJoinerUdpPort;
    p_Var6 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_50,&local_d1)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_d0,
               p_Var6);
    if (local_d0 != (undefined1  [8])0x0) {
      uVar4 = tlv::Tlv::GetValueAsUint16((Tlv *)local_d0);
      uVar2 = local_a8._80_8_;
      local_a8.mJoinerUdpPort = uVar4;
      uVar3 = local_a8._80_8_;
      local_a8.mPresentFlags._1_1_ = SUB81(uVar2,7);
      local_a8._80_7_ = SUB87(uVar3,0);
      local_a8._80_8_ = CONCAT17(local_a8.mPresentFlags._1_1_,local_a8._80_7_) | 0x400000000000000;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_c8);
    local_d1 = kAeUdpPort;
    p_Var6 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_50,&local_d1)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_d0,
               p_Var6);
    if (local_d0 != (undefined1  [8])0x0) {
      uVar4 = tlv::Tlv::GetValueAsUint16((Tlv *)local_d0);
      uVar2 = local_a8._80_8_;
      local_a8.mAeUdpPort = uVar4;
      uVar3 = local_a8._80_8_;
      local_a8.mPresentFlags._1_1_ = SUB81(uVar2,7);
      local_a8._80_7_ = SUB87(uVar3,0);
      local_a8._80_8_ = CONCAT17(local_a8.mPresentFlags._1_1_,local_a8._80_7_) | 0x200000000000000;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_c8);
    local_d1 = kNmkpUdpPort;
    p_Var6 = &std::
              map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
              ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                            *)&local_50,&local_d1)->
              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2> *)local_d0,
               p_Var6);
    if (local_d0 != (undefined1  [8])0x0) {
      uVar4 = tlv::Tlv::GetValueAsUint16((Tlv *)local_d0);
      uVar2 = local_a8._80_8_;
      local_a8.mNmkpUdpPort = uVar4;
      uVar3 = local_a8._80_8_;
      local_a8.mPresentFlags._1_1_ = SUB81(uVar2,7);
      local_a8._80_7_ = SUB87(uVar3,0);
      local_a8._80_8_ = CONCAT17(local_a8.mPresentFlags._1_1_,local_a8._80_7_) | 0x100000000000000;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_c8);
    CommissionerDataset::operator=(aDataset,&local_a8);
  }
  CommissionerDataset::~CommissionerDataset(&local_a8);
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::DecodeCommissionerDataset(CommissionerDataset &aDataset, const coap::Response &aResponse)
{
    Error               error;
    tlv::TlvSet         tlvSet;
    CommissionerDataset dataset;

    SuccessOrExit(error = GetTlvSet(tlvSet, aResponse));

    if (auto sessionId = tlvSet[tlv::Type::kCommissionerSessionId])
    {
        dataset.mSessionId = sessionId->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kSessionIdBit;
    }

    if (auto borderAgentLocator = tlvSet[tlv::Type::kBorderAgentLocator])
    {
        dataset.mBorderAgentLocator = borderAgentLocator->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kBorderAgentLocatorBit;
    }

    if (auto steeringData = tlvSet[tlv::Type::kSteeringData])
    {
        dataset.mSteeringData = steeringData->GetValue();
        dataset.mPresentFlags |= CommissionerDataset::kSteeringDataBit;
    }

    if (auto aeSteeringData = tlvSet[tlv::Type::kAeSteeringData])
    {
        dataset.mAeSteeringData = aeSteeringData->GetValue();
        dataset.mPresentFlags |= CommissionerDataset::kAeSteeringDataBit;
    }

    if (auto nmkpSteeringData = tlvSet[tlv::Type::kNmkpSteeringData])
    {
        dataset.mNmkpSteeringData = nmkpSteeringData->GetValue();
        dataset.mPresentFlags |= CommissionerDataset::kNmkpSteeringDataBit;
    }

    if (auto joinerUdpPort = tlvSet[tlv::Type::kJoinerUdpPort])
    {
        dataset.mJoinerUdpPort = joinerUdpPort->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kJoinerUdpPortBit;
    }

    if (auto aeUdpPort = tlvSet[tlv::Type::kAeUdpPort])
    {
        dataset.mAeUdpPort = aeUdpPort->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kAeUdpPortBit;
    }

    if (auto nmkpUdpPort = tlvSet[tlv::Type::kNmkpUdpPort])
    {
        dataset.mNmkpUdpPort = nmkpUdpPort->GetValueAsUint16();
        dataset.mPresentFlags |= CommissionerDataset::kNmkpUdpPortBit;
    }

    aDataset = dataset;

exit:
    return error;
}